

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf-test.cc
# Opt level: O3

void __thiscall PrintfTest_Float_Test::TestBody(PrintfTest_Float_Test *this)

{
  AssertHelperData *pAVar1;
  AssertHelperData *pAVar2;
  bool bVar3;
  char *pcVar4;
  string_view format;
  string_view format_00;
  string_view format_01;
  string_view format_02;
  string_view format_03;
  string_view format_04;
  string_view format_05;
  string_view format_06;
  string_view format_07;
  string_view format_08;
  string_view format_09;
  string_view format_10;
  string_view format_11;
  string_view format_12;
  string_view format_13;
  string_view format_14;
  string_view format_15;
  string_view format_16;
  basic_string_view<char> format_str;
  basic_string_view<char> format_str_00;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_00;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_18;
  char buffer [256];
  string local_3f8;
  undefined8 local_3d8;
  _Alloc_hider local_3d0 [2];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [40];
  internal local_388 [8];
  undefined8 *local_380;
  undefined1 local_378 [40];
  undefined1 local_350 [32];
  char local_330 [504];
  basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>
  local_138 [4];
  
  local_3c0._0_8_ = (AssertHelperData *)0x40788a6666666666;
  format.size_ = 2;
  format.data_ = "%f";
  test_sprintf<double>((string *)local_350,format,(double *)local_3c0);
  testing::internal::CmpHelperEQ<char[11],std::__cxx11::string>
            ((internal *)local_138,"\"392.650000\"","test_sprintf(\"%f\", 392.65)",
             (char (*) [11])"392.650000",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_350);
  if ((undefined1 *)local_350._0_8_ != local_350 + 0x10) {
    operator_delete((void *)local_350._0_8_);
  }
  if (local_138[0].
      super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
      .parse_context_.format_str_.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_350);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_350._0_8_ + 0x10),"format: ",8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_350._0_8_ + 0x10),"%f",2);
    if ((undefined8 *)
        local_138[0].
        super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
        .parse_context_.format_str_.size_ == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_138[0].
                         super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
                         .parse_context_.format_str_.size_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_3c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x192,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_3c0,(Message *)local_350);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3c0);
    if ((long *)local_350._0_8_ != (long *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && ((long *)local_350._0_8_ != (long *)0x0)) {
        (**(code **)(*(long *)local_350._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_138[0].
            super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
            .parse_context_.format_str_.size_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  format_00.size_ = 2;
  format_00.data_ = "%f";
  make_positional_abi_cxx11_(&local_3f8,format_00);
  local_378._0_8_ = (pointer)0x40788a6666666666;
  local_350._16_8_ = 0;
  local_350._0_8_ = &PTR_grow_0023bf40;
  local_350._24_8_ = 500;
  local_138[0].
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .parse_context_.format_str_.data_ = local_3f8._M_dataplus._M_p;
  local_138[0].
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .parse_context_.format_str_.size_ = local_3f8._M_string_length;
  local_138[0].
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .parse_context_.next_arg_id_ = 0;
  local_138[0].
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .args_.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>>,double>
       ::TYPES;
  local_138[0].
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .loc_.locale_ = (void *)0x0;
  local_350._8_8_ = local_330;
  local_138[0].
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .out_.container = (basic_buffer<char> *)local_350;
  local_138[0].
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .args_.field_1.values_ =
       (value<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
        *)local_378;
  fmt::v5::
  basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>
  ::format(local_138);
  pAVar2 = (AssertHelperData *)(local_3c0 + 0x10);
  local_3c0._0_8_ = pAVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_3c0,local_350._8_8_,(char *)(local_350._8_8_ + local_350._16_8_));
  local_350._0_8_ = &PTR_grow_0023bf40;
  if ((char *)local_350._8_8_ != local_330) {
    operator_delete((void *)local_350._8_8_);
  }
  testing::internal::CmpHelperEQ<char[11],std::__cxx11::string>
            ((internal *)&local_3d8,"\"392.650000\"","fmt::sprintf(make_positional(\"%f\"), 392.65)"
             ,(char (*) [11])"392.650000",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c0);
  if ((AssertHelperData *)local_3c0._0_8_ != pAVar2) {
    operator_delete((void *)local_3c0._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
    operator_delete(local_3f8._M_dataplus._M_p);
  }
  if (local_3d8._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_350);
    if (local_3d0[0]._M_p == (pointer)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_3d0[0]._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x192,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_138,(Message *)local_350);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_138);
    if ((undefined **)local_350._0_8_ != (undefined **)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && ((undefined **)local_350._0_8_ != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_350._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)local_3d0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3c0._0_8_ = (AssertHelperData *)0x40788a6666666666;
  format_01.size_ = 4;
  format_01.data_ = "%.2f";
  test_sprintf<double>((string *)local_350,format_01,(double *)local_3c0);
  testing::internal::CmpHelperEQ<char[7],std::__cxx11::string>
            ((internal *)local_138,"\"392.65\"","test_sprintf(\"%.2f\", 392.65)",
             (char (*) [7])"392.65",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_350);
  if ((undefined1 *)local_350._0_8_ != local_350 + 0x10) {
    operator_delete((void *)local_350._0_8_);
  }
  if (local_138[0].
      super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
      .parse_context_.format_str_.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_350);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_350._0_8_ + 0x10),"format: ",8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_350._0_8_ + 0x10),"%.2f",4)
    ;
    if ((undefined8 *)
        local_138[0].
        super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
        .parse_context_.format_str_.size_ == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_138[0].
                         super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
                         .parse_context_.format_str_.size_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_3c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x193,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_3c0,(Message *)local_350);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3c0);
    if ((undefined **)local_350._0_8_ != (undefined **)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && ((undefined **)local_350._0_8_ != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_350._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_138[0].
            super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
            .parse_context_.format_str_.size_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  format_02.size_ = 4;
  format_02.data_ = "%.2f";
  make_positional_abi_cxx11_(&local_3f8,format_02);
  local_378._0_8_ = (pointer)0x40788a6666666666;
  local_350._16_8_ = 0;
  local_350._0_8_ = &PTR_grow_0023bf40;
  local_350._24_8_ = 500;
  local_138[0].
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .parse_context_.format_str_.data_ = local_3f8._M_dataplus._M_p;
  local_138[0].
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .parse_context_.format_str_.size_ = local_3f8._M_string_length;
  local_138[0].
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .parse_context_.next_arg_id_ = 0;
  local_138[0].
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .args_.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>>,double>
       ::TYPES;
  local_138[0].
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .loc_.locale_ = (void *)0x0;
  local_350._8_8_ = local_330;
  local_138[0].
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .out_.container = (basic_buffer<char> *)local_350;
  local_138[0].
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .args_.field_1.values_ =
       (value<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
        *)local_378;
  fmt::v5::
  basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>
  ::format(local_138);
  local_3c0._0_8_ = pAVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_3c0,local_350._8_8_,(char *)(local_350._8_8_ + local_350._16_8_));
  local_350._0_8_ = &PTR_grow_0023bf40;
  if ((char *)local_350._8_8_ != local_330) {
    operator_delete((void *)local_350._8_8_);
  }
  testing::internal::CmpHelperEQ<char[7],std::__cxx11::string>
            ((internal *)&local_3d8,"\"392.65\"","fmt::sprintf(make_positional(\"%.2f\"), 392.65)",
             (char (*) [7])"392.65",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c0);
  if ((AssertHelperData *)local_3c0._0_8_ != pAVar2) {
    operator_delete((void *)local_3c0._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
    operator_delete(local_3f8._M_dataplus._M_p);
  }
  if (local_3d8._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_350);
    if (local_3d0[0]._M_p == (pointer)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_3d0[0]._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x193,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_138,(Message *)local_350);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_138);
    if ((undefined **)local_350._0_8_ != (undefined **)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && ((undefined **)local_350._0_8_ != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_350._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)local_3d0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3c0._0_8_ = (AssertHelperData *)0x40788a6666666666;
  format_03.size_ = 4;
  format_03.data_ = "%.1f";
  test_sprintf<double>((string *)local_350,format_03,(double *)local_3c0);
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)local_138,"\"392.6\"","test_sprintf(\"%.1f\", 392.65)",
             (char (*) [6])"392.6",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_350);
  if ((undefined1 *)local_350._0_8_ != local_350 + 0x10) {
    operator_delete((void *)local_350._0_8_);
  }
  if (local_138[0].
      super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
      .parse_context_.format_str_.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_350);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_350._0_8_ + 0x10),"format: ",8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_350._0_8_ + 0x10),"%.1f",4)
    ;
    if ((undefined8 *)
        local_138[0].
        super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
        .parse_context_.format_str_.size_ == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_138[0].
                         super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
                         .parse_context_.format_str_.size_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_3c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x194,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_3c0,(Message *)local_350);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3c0);
    if ((undefined **)local_350._0_8_ != (undefined **)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && ((undefined **)local_350._0_8_ != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_350._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_138[0].
            super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
            .parse_context_.format_str_.size_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  format_04.size_ = 4;
  format_04.data_ = "%.1f";
  make_positional_abi_cxx11_(&local_3f8,format_04);
  local_378._0_8_ = (pointer)0x40788a6666666666;
  local_350._16_8_ = 0;
  local_350._0_8_ = &PTR_grow_0023bf40;
  local_350._24_8_ = 500;
  local_138[0].
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .parse_context_.format_str_.data_ = local_3f8._M_dataplus._M_p;
  local_138[0].
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .parse_context_.format_str_.size_ = local_3f8._M_string_length;
  local_138[0].
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .parse_context_.next_arg_id_ = 0;
  local_138[0].
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .args_.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>>,double>
       ::TYPES;
  local_138[0].
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .loc_.locale_ = (void *)0x0;
  local_350._8_8_ = local_330;
  local_138[0].
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .out_.container = (basic_buffer<char> *)local_350;
  local_138[0].
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .args_.field_1.values_ =
       (value<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
        *)local_378;
  fmt::v5::
  basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>
  ::format(local_138);
  local_3c0._0_8_ = pAVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_3c0,local_350._8_8_,(char *)(local_350._8_8_ + local_350._16_8_));
  local_350._0_8_ = &PTR_grow_0023bf40;
  if ((char *)local_350._8_8_ != local_330) {
    operator_delete((void *)local_350._8_8_);
  }
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&local_3d8,"\"392.6\"","fmt::sprintf(make_positional(\"%.1f\"), 392.65)",
             (char (*) [6])"392.6",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c0);
  if ((AssertHelperData *)local_3c0._0_8_ != pAVar2) {
    operator_delete((void *)local_3c0._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
    operator_delete(local_3f8._M_dataplus._M_p);
  }
  if (local_3d8._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_350);
    if (local_3d0[0]._M_p == (pointer)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_3d0[0]._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x194,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_138,(Message *)local_350);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_138);
    if ((undefined **)local_350._0_8_ != (undefined **)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && ((undefined **)local_350._0_8_ != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_350._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)local_3d0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3c0._0_8_ = (AssertHelperData *)0x40788a6666666666;
  format_05.size_ = 3;
  format_05.data_ = "%.f";
  test_sprintf<double>((string *)local_350,format_05,(double *)local_3c0);
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            ((internal *)local_138,"\"393\"","test_sprintf(\"%.f\", 392.65)",(char (*) [4])"393",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_350);
  if ((undefined1 *)local_350._0_8_ != local_350 + 0x10) {
    operator_delete((void *)local_350._0_8_);
  }
  if (local_138[0].
      super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
      .parse_context_.format_str_.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_350);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_350._0_8_ + 0x10),"format: ",8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_350._0_8_ + 0x10),"%.f",3);
    if ((undefined8 *)
        local_138[0].
        super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
        .parse_context_.format_str_.size_ == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_138[0].
                         super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
                         .parse_context_.format_str_.size_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_3c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x195,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_3c0,(Message *)local_350);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3c0);
    if ((undefined **)local_350._0_8_ != (undefined **)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && ((undefined **)local_350._0_8_ != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_350._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_138[0].
            super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
            .parse_context_.format_str_.size_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  format_06.size_ = 3;
  format_06.data_ = "%.f";
  make_positional_abi_cxx11_(&local_3f8,format_06);
  local_378._0_8_ = (pointer)0x40788a6666666666;
  local_350._16_8_ = 0;
  local_350._0_8_ = &PTR_grow_0023bf40;
  local_350._24_8_ = 500;
  local_138[0].
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .parse_context_.format_str_.data_ = local_3f8._M_dataplus._M_p;
  local_138[0].
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .parse_context_.format_str_.size_ = local_3f8._M_string_length;
  local_138[0].
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .parse_context_.next_arg_id_ = 0;
  local_138[0].
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .args_.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>>,double>
       ::TYPES;
  local_138[0].
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .loc_.locale_ = (void *)0x0;
  local_350._8_8_ = local_330;
  local_138[0].
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .out_.container = (basic_buffer<char> *)local_350;
  local_138[0].
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .args_.field_1.values_ =
       (value<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
        *)local_378;
  fmt::v5::
  basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>
  ::format(local_138);
  local_3c0._0_8_ = pAVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_3c0,local_350._8_8_,(char *)(local_350._8_8_ + local_350._16_8_));
  local_350._0_8_ = &PTR_grow_0023bf40;
  if ((char *)local_350._8_8_ != local_330) {
    operator_delete((void *)local_350._8_8_);
  }
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            ((internal *)&local_3d8,"\"393\"","fmt::sprintf(make_positional(\"%.f\"), 392.65)",
             (char (*) [4])"393",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c0);
  if ((AssertHelperData *)local_3c0._0_8_ != pAVar2) {
    operator_delete((void *)local_3c0._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
    operator_delete(local_3f8._M_dataplus._M_p);
  }
  if (local_3d8._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_350);
    if (local_3d0[0]._M_p == (pointer)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_3d0[0]._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x195,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_138,(Message *)local_350);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_138);
    if ((undefined **)local_350._0_8_ != (undefined **)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && ((undefined **)local_350._0_8_ != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_350._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)local_3d0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3c0._0_8_ = (AssertHelperData *)0x40788a6666666666;
  format_07.size_ = 2;
  format_07.data_ = "%F";
  test_sprintf<double>((string *)local_350,format_07,(double *)local_3c0);
  testing::internal::CmpHelperEQ<char[11],std::__cxx11::string>
            ((internal *)local_138,"\"392.650000\"","test_sprintf(\"%F\", 392.65)",
             (char (*) [11])"392.650000",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_350);
  if ((undefined1 *)local_350._0_8_ != local_350 + 0x10) {
    operator_delete((void *)local_350._0_8_);
  }
  if (local_138[0].
      super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
      .parse_context_.format_str_.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_350);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_350._0_8_ + 0x10),"format: ",8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_350._0_8_ + 0x10),"%F",2);
    if ((undefined8 *)
        local_138[0].
        super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
        .parse_context_.format_str_.size_ == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_138[0].
                         super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
                         .parse_context_.format_str_.size_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_3c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x196,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_3c0,(Message *)local_350);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3c0);
    if ((undefined **)local_350._0_8_ != (undefined **)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && ((undefined **)local_350._0_8_ != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_350._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_138[0].
            super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
            .parse_context_.format_str_.size_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  format_08.size_ = 2;
  format_08.data_ = "%F";
  make_positional_abi_cxx11_(&local_3f8,format_08);
  local_378._0_8_ = (AssertHelperData *)0x40788a6666666666;
  local_350._16_8_ = 0;
  local_350._0_8_ = &PTR_grow_0023bf40;
  local_350._24_8_ = 500;
  local_138[0].
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .parse_context_.format_str_.data_ = local_3f8._M_dataplus._M_p;
  local_138[0].
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .parse_context_.format_str_.size_ = local_3f8._M_string_length;
  local_138[0].
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .parse_context_.next_arg_id_ = 0;
  local_138[0].
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .args_.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>>,double>
       ::TYPES;
  local_138[0].
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .loc_.locale_ = (void *)0x0;
  local_350._8_8_ = local_330;
  local_138[0].
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .out_.container = (basic_buffer<char> *)local_350;
  local_138[0].
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .args_.field_1.values_ =
       (value<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
        *)local_378;
  fmt::v5::
  basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>
  ::format(local_138);
  local_3c0._0_8_ = pAVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_3c0,local_350._8_8_,(char *)(local_350._8_8_ + local_350._16_8_));
  local_350._0_8_ = &PTR_grow_0023bf40;
  if ((char *)local_350._8_8_ != local_330) {
    operator_delete((void *)local_350._8_8_);
  }
  testing::internal::CmpHelperEQ<char[11],std::__cxx11::string>
            ((internal *)&local_3d8,"\"392.650000\"","fmt::sprintf(make_positional(\"%F\"), 392.65)"
             ,(char (*) [11])"392.650000",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c0);
  if ((AssertHelperData *)local_3c0._0_8_ != pAVar2) {
    operator_delete((void *)local_3c0._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
    operator_delete(local_3f8._M_dataplus._M_p);
  }
  if (local_3d8._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_350);
    if (local_3d0[0]._M_p == (pointer)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_3d0[0]._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x196,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_138,(Message *)local_350);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_138);
    if ((undefined **)local_350._0_8_ != (undefined **)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && ((undefined **)local_350._0_8_ != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_350._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)local_3d0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  safe_sprintf<256ul>((char (*) [256])local_138,"%e",0x66666666);
  local_3f8._M_dataplus._M_p = (pointer)0x40788a6666666666;
  format_09.size_ = 2;
  format_09.data_ = "%e";
  test_sprintf<double>((string *)local_350,format_09,(double *)&local_3f8);
  testing::internal::CmpHelperEQ<char[256],std::__cxx11::string>
            ((internal *)local_3c0,"buffer","test_sprintf(\"%e\", 392.65)",(char (*) [256])local_138
             ,(string *)local_350);
  if ((undefined1 *)local_350._0_8_ != local_350 + 0x10) {
    operator_delete((void *)local_350._0_8_);
  }
  if (local_3c0[0] == (string)0x0) {
    testing::Message::Message((Message *)local_350);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_350._0_8_ + 0x10),"format: ",8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_350._0_8_ + 0x10),"%e",2);
    if ((undefined8 *)local_3c0._8_8_ == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_3c0._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_3f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x199,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_3f8,(Message *)local_350);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3f8);
    if ((undefined **)local_350._0_8_ != (undefined **)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && ((undefined **)local_350._0_8_ != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_350._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_3c0 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  format_10.size_ = 2;
  format_10.data_ = "%e";
  make_positional_abi_cxx11_((string *)local_378,format_10);
  local_3d8 = 0x40788a6666666666;
  local_350._16_8_ = 0;
  local_350._0_8_ = &PTR_grow_0023bf40;
  local_350._24_8_ = 500;
  local_3c0._0_8_ = local_378._0_8_;
  local_3c0._8_8_ = local_378._8_8_;
  local_3b0._0_4_ = 0;
  local_3b0._16_8_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>>,double>
       ::TYPES;
  local_3b0._24_8_ = &local_3d8;
  local_3b0._32_8_ = (void *)0x0;
  local_3b0._8_8_ = (string *)local_350;
  local_350._8_8_ = local_330;
  fmt::v5::
  basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>
  ::format((basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>
            *)local_3c0);
  local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3f8,local_350._8_8_,(char *)(local_350._8_8_ + local_350._16_8_));
  local_350._0_8_ = &PTR_grow_0023bf40;
  if ((char *)local_350._8_8_ != local_330) {
    operator_delete((void *)local_350._8_8_);
  }
  testing::internal::CmpHelperEQ<char[256],std::__cxx11::string>
            (local_388,"buffer","fmt::sprintf(make_positional(\"%e\"), 392.65)",
             (char (*) [256])local_138,&local_3f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
    operator_delete(local_3f8._M_dataplus._M_p);
  }
  pAVar2 = (AssertHelperData *)(local_378 + 0x10);
  if ((AssertHelperData *)local_378._0_8_ != pAVar2) {
    operator_delete((void *)local_378._0_8_);
  }
  if (local_388[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_350);
    if (local_380 == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (char *)*local_380;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_3c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x199,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_3c0,(Message *)local_350);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3c0);
    if ((undefined **)local_350._0_8_ != (undefined **)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && ((undefined **)local_350._0_8_ != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_350._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_388 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  safe_sprintf<256ul>((char (*) [256])local_138,"%E",0x66666666);
  local_3f8._M_dataplus._M_p = (pointer)0x40788a6666666666;
  format_11.size_ = 2;
  format_11.data_ = "%E";
  test_sprintf<double>((string *)local_350,format_11,(double *)&local_3f8);
  testing::internal::CmpHelperEQ<char[256],std::__cxx11::string>
            ((internal *)local_3c0,"buffer","test_sprintf(\"%E\", 392.65)",(char (*) [256])local_138
             ,(string *)local_350);
  pAVar1 = (AssertHelperData *)(local_3c0 + 0x10);
  if ((undefined1 *)local_350._0_8_ != local_350 + 0x10) {
    operator_delete((void *)local_350._0_8_);
  }
  if (local_3c0[0] == (string)0x0) {
    testing::Message::Message((Message *)local_350);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_350._0_8_ + 0x10),"format: ",8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_350._0_8_ + 0x10),"%E",2);
    if ((undefined8 *)local_3c0._8_8_ == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_3c0._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_3f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x19b,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_3f8,(Message *)local_350);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3f8);
    if ((undefined **)local_350._0_8_ != (undefined **)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && ((undefined **)local_350._0_8_ != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_350._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_3c0 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  format_12.size_ = 2;
  format_12.data_ = "%E";
  make_positional_abi_cxx11_((string *)local_378,format_12);
  local_3d8 = 0x40788a6666666666;
  local_350._16_8_ = 0;
  local_350._0_8_ = &PTR_grow_0023bf40;
  local_350._24_8_ = 500;
  local_3c0._0_8_ = local_378._0_8_;
  local_3c0._8_8_ = local_378._8_8_;
  local_3b0._0_4_ = 0;
  local_3b0._16_8_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>>,double>
       ::TYPES;
  local_3b0._24_8_ = &local_3d8;
  local_3b0._32_8_ = (void *)0x0;
  local_3b0._8_8_ = (string *)local_350;
  local_350._8_8_ = local_330;
  fmt::v5::
  basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>
  ::format((basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>
            *)local_3c0);
  local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3f8,local_350._8_8_,(char *)(local_350._8_8_ + local_350._16_8_));
  local_350._0_8_ = &PTR_grow_0023bf40;
  if ((char *)local_350._8_8_ != local_330) {
    operator_delete((void *)local_350._8_8_);
  }
  testing::internal::CmpHelperEQ<char[256],std::__cxx11::string>
            (local_388,"buffer","fmt::sprintf(make_positional(\"%E\"), 392.65)",
             (char (*) [256])local_138,&local_3f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
    operator_delete(local_3f8._M_dataplus._M_p);
  }
  if ((AssertHelperData *)local_378._0_8_ != pAVar2) {
    operator_delete((void *)local_378._0_8_);
  }
  if (local_388[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_350);
    if (local_380 == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (char *)*local_380;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_3c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x19b,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_3c0,(Message *)local_350);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3c0);
    if ((undefined **)local_350._0_8_ != (undefined **)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && ((undefined **)local_350._0_8_ != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_350._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_388 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_3f8._M_dataplus._M_p = (pointer)0x40788a6666666666;
  format_13.size_ = 2;
  format_13.data_ = "%g";
  test_sprintf<double>((string *)local_350,format_13,(double *)&local_3f8);
  testing::internal::CmpHelperEQ<char[7],std::__cxx11::string>
            ((internal *)local_3c0,"\"392.65\"","test_sprintf(\"%g\", 392.65)",
             (char (*) [7])"392.65",(string *)local_350);
  if ((undefined1 *)local_350._0_8_ != local_350 + 0x10) {
    operator_delete((void *)local_350._0_8_);
  }
  if (local_3c0[0] == (string)0x0) {
    testing::Message::Message((Message *)local_350);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_350._0_8_ + 0x10),"format: ",8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_350._0_8_ + 0x10),"%g",2);
    if ((undefined8 *)local_3c0._8_8_ == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_3c0._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_3f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x19c,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_3f8,(Message *)local_350);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3f8);
    if ((undefined **)local_350._0_8_ != (undefined **)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && ((undefined **)local_350._0_8_ != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_350._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_3c0 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  format_14.size_ = 2;
  format_14.data_ = "%g";
  make_positional_abi_cxx11_((string *)local_378,format_14);
  local_3d8 = 0x40788a6666666666;
  local_350._16_8_ = 0;
  local_350._0_8_ = &PTR_grow_0023bf40;
  local_350._24_8_ = 500;
  local_3c0._0_8_ = local_378._0_8_;
  local_3c0._8_8_ = local_378._8_8_;
  local_3b0._0_4_ = 0;
  local_3b0._16_8_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>>,double>
       ::TYPES;
  local_3b0._24_8_ = &local_3d8;
  local_3b0._32_8_ = (void *)0x0;
  local_3b0._8_8_ = (string *)local_350;
  local_350._8_8_ = local_330;
  fmt::v5::
  basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>
  ::format((basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>
            *)local_3c0);
  local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3f8,local_350._8_8_,(char *)(local_350._8_8_ + local_350._16_8_));
  local_350._0_8_ = &PTR_grow_0023bf40;
  if ((char *)local_350._8_8_ != local_330) {
    operator_delete((void *)local_350._8_8_);
  }
  testing::internal::CmpHelperEQ<char[7],std::__cxx11::string>
            (local_388,"\"392.65\"","fmt::sprintf(make_positional(\"%g\"), 392.65)",
             (char (*) [7])"392.65",&local_3f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
    operator_delete(local_3f8._M_dataplus._M_p);
  }
  if ((AssertHelperData *)local_378._0_8_ != pAVar2) {
    operator_delete((void *)local_378._0_8_);
  }
  if (local_388[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_350);
    if (local_380 == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (char *)*local_380;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_3c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x19c,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_3c0,(Message *)local_350);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3c0);
    if ((undefined **)local_350._0_8_ != (undefined **)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && ((undefined **)local_350._0_8_ != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_350._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_388 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_3f8._M_dataplus._M_p = (pointer)0x40788a6666666666;
  format_15.size_ = 2;
  format_15.data_ = "%G";
  test_sprintf<double>((string *)local_350,format_15,(double *)&local_3f8);
  testing::internal::CmpHelperEQ<char[7],std::__cxx11::string>
            ((internal *)local_3c0,"\"392.65\"","test_sprintf(\"%G\", 392.65)",
             (char (*) [7])"392.65",(string *)local_350);
  if ((undefined1 *)local_350._0_8_ != local_350 + 0x10) {
    operator_delete((void *)local_350._0_8_);
  }
  if (local_3c0[0] == (string)0x0) {
    testing::Message::Message((Message *)local_350);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_350._0_8_ + 0x10),"format: ",8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_350._0_8_ + 0x10),"%G",2);
    if ((undefined8 *)local_3c0._8_8_ == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_3c0._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_3f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x19d,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_3f8,(Message *)local_350);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3f8);
    if ((undefined **)local_350._0_8_ != (undefined **)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && ((undefined **)local_350._0_8_ != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_350._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_3c0 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  format_16.size_ = 2;
  format_16.data_ = "%G";
  make_positional_abi_cxx11_((string *)local_378,format_16);
  local_3d8 = 0x40788a6666666666;
  local_350._16_8_ = 0;
  local_350._0_8_ = &PTR_grow_0023bf40;
  local_350._24_8_ = 500;
  local_3c0._0_8_ = local_378._0_8_;
  local_3c0._8_8_ = local_378._8_8_;
  local_3b0._0_4_ = 0;
  local_3b0._16_8_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>>,double>
       ::TYPES;
  local_3b0._24_8_ = &local_3d8;
  local_3b0._32_8_ = (void *)0x0;
  local_3b0._8_8_ = (string *)local_350;
  local_350._8_8_ = local_330;
  fmt::v5::
  basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>
  ::format((basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>
            *)local_3c0);
  local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3f8,local_350._8_8_,(char *)(local_350._8_8_ + local_350._16_8_));
  local_350._0_8_ = &PTR_grow_0023bf40;
  if ((char *)local_350._8_8_ != local_330) {
    operator_delete((void *)local_350._8_8_);
  }
  testing::internal::CmpHelperEQ<char[7],std::__cxx11::string>
            (local_388,"\"392.65\"","fmt::sprintf(make_positional(\"%G\"), 392.65)",
             (char (*) [7])"392.65",&local_3f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
    operator_delete(local_3f8._M_dataplus._M_p);
  }
  if ((AssertHelperData *)local_378._0_8_ != pAVar2) {
    operator_delete((void *)local_378._0_8_);
  }
  if (local_388[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_350);
    if (local_380 == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (char *)*local_380;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_3c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x19d,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_3c0,(Message *)local_350);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3c0);
    if ((undefined **)local_350._0_8_ != (undefined **)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && ((undefined **)local_350._0_8_ != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_350._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_388 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  safe_sprintf<256ul>((char (*) [256])local_138,"%a",0x66666666);
  local_3f8._M_dataplus._M_p = (pointer)0xc0788a6666666666;
  local_350._16_8_ = 0;
  local_350._0_8_ = &PTR_grow_0023bf40;
  local_350._24_8_ = 500;
  format_str.size_ = 4;
  format_str.data_ = "{:a}";
  args.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_3f8;
  args.types_ = fmt::v5::
                format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,double>
                ::TYPES;
  local_350._8_8_ = local_330;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)local_350,format_str,args,(locale_ref)0x0);
  local_3c0._0_8_ = pAVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_3c0,local_350._8_8_,(char *)(local_350._8_8_ + local_350._16_8_));
  local_350._0_8_ = &PTR_grow_0023bf40;
  if ((char *)local_350._8_8_ != local_330) {
    operator_delete((void *)local_350._8_8_);
  }
  testing::internal::CmpHelperEQ<char[256],std::__cxx11::string>
            ((internal *)local_378,"buffer","format(\"{:a}\", -392.65)",(char (*) [256])local_138,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c0);
  if ((AssertHelperData *)local_3c0._0_8_ != pAVar1) {
    operator_delete((void *)local_3c0._0_8_);
  }
  if (local_378[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_350);
    if ((undefined8 *)local_378._8_8_ == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_378._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_3c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x19f,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_3c0,(Message *)local_350);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3c0);
    if ((undefined **)local_350._0_8_ != (undefined **)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && ((undefined **)local_350._0_8_ != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_350._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_378 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  safe_sprintf<256ul>((char (*) [256])local_138,"%A",0x66666666);
  local_3f8._M_dataplus._M_p = (pointer)0xc0788a6666666666;
  local_350._16_8_ = 0;
  local_350._0_8_ = &PTR_grow_0023bf40;
  local_350._24_8_ = 500;
  format_str_00.size_ = 4;
  format_str_00.data_ = "{:A}";
  args_00.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_3f8;
  args_00.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,double>
       ::TYPES;
  local_350._8_8_ = local_330;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)local_350,format_str_00,args_00,(locale_ref)0x0);
  local_3c0._0_8_ = pAVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_3c0,local_350._8_8_,(char *)(local_350._8_8_ + local_350._16_8_));
  local_350._0_8_ = &PTR_grow_0023bf40;
  if ((char *)local_350._8_8_ != local_330) {
    operator_delete((void *)local_350._8_8_);
  }
  testing::internal::CmpHelperEQ<char[256],std::__cxx11::string>
            ((internal *)local_378,"buffer","format(\"{:A}\", -392.65)",(char (*) [256])local_138,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c0);
  if ((AssertHelperData *)local_3c0._0_8_ != pAVar1) {
    operator_delete((void *)local_3c0._0_8_);
  }
  if (local_378[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_350);
    if ((undefined8 *)local_378._8_8_ == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_378._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_3c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x1a1,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_3c0,(Message *)local_350);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3c0);
    if ((undefined **)local_350._0_8_ != (undefined **)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && ((undefined **)local_350._0_8_ != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_350._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_378 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  return;
}

Assistant:

TEST(PrintfTest, Float) {
  EXPECT_PRINTF("392.650000", "%f", 392.65);
  EXPECT_PRINTF("392.65", "%.2f", 392.65);
  EXPECT_PRINTF("392.6", "%.1f", 392.65);
  EXPECT_PRINTF("393", "%.f", 392.65);
  EXPECT_PRINTF("392.650000", "%F", 392.65);
  char buffer[BUFFER_SIZE];
  safe_sprintf(buffer, "%e", 392.65);
  EXPECT_PRINTF(buffer, "%e", 392.65);
  safe_sprintf(buffer, "%E", 392.65);
  EXPECT_PRINTF(buffer, "%E", 392.65);
  EXPECT_PRINTF("392.65", "%g", 392.65);
  EXPECT_PRINTF("392.65", "%G", 392.65);
  safe_sprintf(buffer, "%a", -392.65);
  EXPECT_EQ(buffer, format("{:a}", -392.65));
  safe_sprintf(buffer, "%A", -392.65);
  EXPECT_EQ(buffer, format("{:A}", -392.65));
}